

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.cpp
# Opt level: O3

istream * maths::operator>>(istream *is,Matrix *m)

{
  ulong uVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  
  iVar2 = m->rows_;
  if (0 < iVar2) {
    uVar1 = (ulong)(uint)m->cols_;
    lVar4 = 0;
    do {
      if (0 < (int)uVar1) {
        lVar3 = 0;
        do {
          std::istream::_M_extract<double>((double *)is);
          lVar3 = lVar3 + 1;
          uVar1 = (ulong)m->cols_;
        } while (lVar3 < (long)uVar1);
        iVar2 = m->rows_;
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < iVar2);
  }
  return is;
}

Assistant:

istream& operator>>(istream& is, Matrix& m)
{
    for (int i = 0; i < m.rows_; ++i) {
        for (int j = 0; j < m.cols_; ++j) {
            is >> m.p[i][j];
        }
    }
    return is;
}